

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_losertree.cpp
# Opt level: O0

void mergesort_losertree<64u>(uchar **strings,size_t n,uchar **tmp)

{
  uchar **strings_00;
  size_t n_00;
  ostream *poVar1;
  ulong uVar2;
  reference pvVar3;
  iterator begin;
  iterator end;
  uchar *puVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 local_490 [8];
  loser_tree<unsigned_char_*> tree;
  uchar **result;
  unsigned_long uStack_468;
  uint i_1;
  uchar **local_460;
  pair<unsigned_char_**,_unsigned_long> local_458;
  uchar **local_448;
  pair<unsigned_char_**,_unsigned_long> local_440;
  uint local_42c;
  undefined1 local_428 [4];
  uint i;
  array<std::pair<unsigned_char_**,_unsigned_long>,_64UL> ranges;
  size_t split;
  uchar **tmp_local;
  size_t n_local;
  uchar **strings_local;
  
  if (n < 0x10000) {
    mergesort_4way(strings,n,tmp);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,"mergesort_losertree");
    poVar1 = std::operator<<(poVar1,"(), n=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
    std::operator<<(poVar1,"\n");
    auVar6._8_4_ = (int)(n >> 0x20);
    auVar6._0_8_ = n;
    auVar6._12_4_ = 0x45300000;
    dVar5 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * 0.015625;
    uVar2 = (ulong)dVar5;
    ranges._M_elems[0x3f].second =
         uVar2 | (long)(dVar5 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
    std::array<std::pair<unsigned_char_**,_unsigned_long>,_64UL>::array
              ((array<std::pair<unsigned_char_**,_unsigned_long>,_64UL> *)local_428);
    for (local_42c = 0; local_42c < 0x3f; local_42c = local_42c + 1) {
      local_448 = strings + local_42c * ranges._M_elems[0x3f].second;
      local_440 = std::make_pair<unsigned_char**,unsigned_long_const&>
                            (&local_448,&ranges._M_elems[0x3f].second);
      pvVar3 = std::array<std::pair<unsigned_char_**,_unsigned_long>,_64UL>::operator[]
                         ((array<std::pair<unsigned_char_**,_unsigned_long>,_64UL> *)local_428,
                          (ulong)local_42c);
      std::pair<unsigned_char_**,_unsigned_long>::operator=(pvVar3,&local_440);
    }
    local_460 = strings + ranges._M_elems[0x3f].second * 0x3f;
    uStack_468 = n + ranges._M_elems[0x3f].second * -0x3f;
    local_458 = std::make_pair<unsigned_char**,unsigned_long>(&local_460,&stack0xfffffffffffffb98);
    pvVar3 = std::array<std::pair<unsigned_char_**,_unsigned_long>,_64UL>::operator[]
                       ((array<std::pair<unsigned_char_**,_unsigned_long>,_64UL> *)local_428,0x3f);
    std::pair<unsigned_char_**,_unsigned_long>::operator=(pvVar3,&local_458);
    for (result._4_4_ = 0; result._4_4_ < 0x40; result._4_4_ = result._4_4_ + 1) {
      pvVar3 = std::array<std::pair<unsigned_char_**,_unsigned_long>,_64UL>::operator[]
                         ((array<std::pair<unsigned_char_**,_unsigned_long>,_64UL> *)local_428,
                          (ulong)result._4_4_);
      strings_00 = pvVar3->first;
      pvVar3 = std::array<std::pair<unsigned_char_**,_unsigned_long>,_64UL>::operator[]
                         ((array<std::pair<unsigned_char_**,_unsigned_long>,_64UL> *)local_428,
                          (ulong)result._4_4_);
      n_00 = pvVar3->second;
      pvVar3 = std::array<std::pair<unsigned_char_**,_unsigned_long>,_64UL>::operator[]
                         ((array<std::pair<unsigned_char_**,_unsigned_long>,_64UL> *)local_428,
                          (ulong)result._4_4_);
      mergesort_losertree<64u>(strings_00,n_00,tmp + ((long)pvVar3->first - (long)strings >> 3));
    }
    tree._16_8_ = tmp;
    begin = std::array<std::pair<unsigned_char_**,_unsigned_long>,_64UL>::begin
                      ((array<std::pair<unsigned_char_**,_unsigned_long>,_64UL> *)local_428);
    end = std::array<std::pair<unsigned_char_**,_unsigned_long>,_64UL>::end
                    ((array<std::pair<unsigned_char_**,_unsigned_long>,_64UL> *)local_428);
    loser_tree<unsigned_char*>::loser_tree<std::pair<unsigned_char**,unsigned_long>*>
              ((loser_tree<unsigned_char*> *)local_490,begin,end);
    while ((int)tree._streams != 0) {
      puVar4 = loser_tree<unsigned_char_*>::min((loser_tree<unsigned_char_*> *)local_490);
      *(uchar **)tree._16_8_ = puVar4;
      tree._16_8_ = tree._16_8_ + 8;
    }
    memcpy(strings,tmp,n << 3);
    loser_tree<unsigned_char_*>::~loser_tree((loser_tree<unsigned_char_*> *)local_490);
  }
  return;
}

Assistant:

static void
mergesort_losertree(unsigned char** strings, size_t n, unsigned char** tmp)
{
	if (n < 0x10000) {
		mergesort_4way(strings, n, tmp);
		return;
	}
	debug() << __func__ << "(), n="<<n<<"\n";
	const size_t split = size_t(double(n) / double(K));
	std::array<std::pair<unsigned char**, size_t>, K> ranges;
	for (unsigned i=0; i < K-1; ++i) {
		ranges[i] = std::make_pair(strings+i*split, split);
	}
	ranges[K-1] = std::make_pair(strings+(K-1)*split, n-(K-1)*split);
	for (unsigned i=0; i < K; ++i) {
		mergesort_losertree<K>(ranges[i].first, ranges[i].second,
				tmp+(ranges[i].first-strings));
	}
	unsigned char** result = tmp;
	loser_tree<unsigned char*> tree(ranges.begin(), ranges.end());
	while (tree._nonempty_streams) { *result++ = tree.min(); }
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
}